

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

void __thiscall
mocker::nasm::Section::
emplaceLine<mocker::nasm::CJump,mocker::nasm::CJump::OpType,std::shared_ptr<mocker::nasm::Label>>
          (Section *this,string *label,OpType *args,shared_ptr<mocker::nasm::Label> *args_1)

{
  shared_ptr<mocker::nasm::CJump> local_38;
  shared_ptr<mocker::nasm::Label> *local_28;
  shared_ptr<mocker::nasm::Label> *args_local_1;
  OpType *args_local;
  string *label_local;
  Section *this_local;
  
  local_28 = args_1;
  args_local_1 = (shared_ptr<mocker::nasm::Label> *)args;
  args_local = (OpType *)label;
  label_local = &this->name;
  std::
  make_shared<mocker::nasm::CJump,mocker::nasm::CJump::OpType,std::shared_ptr<mocker::nasm::Label>>
            ((OpType *)&local_38,(shared_ptr<mocker::nasm::Label> *)args);
  std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
  emplace_back<std::__cxx11::string,std::shared_ptr<mocker::nasm::CJump>>
            ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&this->lines,label,
             &local_38);
  std::shared_ptr<mocker::nasm::CJump>::~shared_ptr(&local_38);
  return;
}

Assistant:

void emplaceLine(std::string label, Args &&... args) {
    lines.emplace_back(std::move(label),
                       std::make_shared<Type>(std::forward<Args>(args)...));
  }